

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O3

Clause * Clause_new<vec<Lit>>(vec<Lit> *ps,bool learnt)

{
  Clause *this;
  size_t __size;
  
  __size = 8;
  if (ps->sz != 0) {
    __size = (ulong)(ps->sz - 1) * 4 + 8;
  }
  this = (Clause *)malloc(__size);
  Clause::Clause<vec<Lit>>(this,ps,false);
  return this;
}

Assistant:

static Clause* Clause_new(const V& ps, bool learnt = false) {
	size_t s = 0;
	if (ps.size() != 0) {
		s = ps.size() - 1;
	}
	const size_t mem_size = sizeof(Clause) + s * sizeof(Lit) + (learnt ? 3 : 0) * sizeof(int);
	void* mem = malloc(mem_size);
	auto* newClause = new (mem) Clause(ps, learnt);
	return newClause;
}